

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::CharReaderBuilder::validate(CharReaderBuilder *this,Value *invalid)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ushort uVar2;
  ValueHolder VVar3;
  ValueHolder VVar4;
  ValueHolder VVar5;
  ValueHolder VVar6;
  _Alloc_hider _Var7;
  ArrayIndex AVar8;
  iterator iVar9;
  undefined1 *other;
  ValueHolder *pVVar10;
  long lVar11;
  long lVar12;
  Members keys;
  size_type __dnew;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  valid_keys;
  Value my_invalid;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  pointer local_c8;
  Value *local_c0;
  ValueHolder local_b8;
  ushort local_b0;
  ValueHolder local_a8;
  ValueHolder local_a0;
  ValueHolder local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  Value *local_60;
  Value local_58;
  
  local_58._8_2_ = local_58._8_2_ & 0xfe00;
  local_58.comments_ = (CommentInfo *)0x0;
  local_58.start_ = 0;
  local_58.limit_ = 0;
  local_c0 = invalid;
  if (invalid == (Value *)0x0) {
    local_c0 = &local_58;
  }
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&local_90);
  paVar1 = &local_e8.field_2;
  local_e8.field_2._M_allocated_capacity._0_5_ = 0x656c6c6f63;
  local_e8.field_2._M_allocated_capacity._5_2_ = 0x7463;
  local_e8.field_2._M_local_buf[7] = 'C';
  local_e8.field_2._8_2_ = 0x6d6f;
  local_e8.field_2._M_local_buf[10] = 'm';
  local_e8.field_2._M_local_buf[0xb] = 'e';
  local_e8.field_2._M_local_buf[0xc] = 'n';
  local_e8.field_2._M_local_buf[0xd] = 't';
  local_e8.field_2._M_local_buf[0xe] = 's';
  local_e8._M_string_length = 0xf;
  local_e8.field_2._M_local_buf[0xf] = '\0';
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_90,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  local_e8.field_2._M_allocated_capacity._0_5_ = 0x776f6c6c61;
  local_e8.field_2._M_allocated_capacity._5_2_ = 0x6f43;
  local_e8.field_2._M_local_buf[7] = 'm';
  local_e8.field_2._8_2_ = 0x656d;
  local_e8.field_2._M_local_buf[10] = 'n';
  local_e8.field_2._M_local_buf[0xb] = 't';
  local_e8.field_2._M_local_buf[0xc] = 's';
  local_e8._M_string_length = 0xd;
  local_e8.field_2._M_local_buf[0xd] = '\0';
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_90,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  local_e8.field_2._M_allocated_capacity._0_5_ = 0x6369727473;
  local_e8.field_2._M_allocated_capacity._5_2_ = 0x5274;
  local_e8.field_2._M_local_buf[7] = 'o';
  local_e8.field_2._8_2_ = 0x746f;
  local_e8._M_string_length = 10;
  local_e8.field_2._M_local_buf[10] = '\0';
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_90,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  local_c8 = (pointer)0x1c;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  local_e8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_e8,(ulong)&local_c8);
  local_e8.field_2._M_allocated_capacity._0_5_ = SUB85(local_c8,0);
  local_e8.field_2._M_allocated_capacity._5_2_ = (undefined2)((ulong)local_c8 >> 0x28);
  local_e8.field_2._M_local_buf[7] = (char)((ulong)local_c8 >> 0x38);
  builtin_strncpy(local_e8._M_dataplus._M_p,"allowDroppedNullPlaceholders",0x1c);
  local_e8._M_string_length = (size_type)local_c8;
  local_e8._M_dataplus._M_p[(long)local_c8] = '\0';
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_90,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  local_c8 = (pointer)0x10;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  local_e8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_e8,(ulong)&local_c8);
  local_e8.field_2._M_allocated_capacity._0_5_ = SUB85(local_c8,0);
  local_e8.field_2._M_allocated_capacity._5_2_ = (undefined2)((ulong)local_c8 >> 0x28);
  local_e8.field_2._M_local_buf[7] = (char)((ulong)local_c8 >> 0x38);
  builtin_strncpy(local_e8._M_dataplus._M_p,"allowNumericKeys",0x10);
  local_e8._M_string_length = (size_type)local_c8;
  local_e8._M_dataplus._M_p[(long)local_c8] = '\0';
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_90,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  local_c8 = (pointer)0x11;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  local_e8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_e8,(ulong)&local_c8);
  local_e8.field_2._M_allocated_capacity._0_5_ = SUB85(local_c8,0);
  local_e8.field_2._M_allocated_capacity._5_2_ = (undefined2)((ulong)local_c8 >> 0x28);
  local_e8.field_2._M_local_buf[7] = (char)((ulong)local_c8 >> 0x38);
  builtin_strncpy(local_e8._M_dataplus._M_p,"allowSingleQuotes",0x11);
  local_e8._M_string_length = (size_type)local_c8;
  local_e8._M_dataplus._M_p[(long)local_c8] = '\0';
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_90,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  local_e8.field_2._M_allocated_capacity._0_5_ = 0x6b63617473;
  local_e8.field_2._M_allocated_capacity._5_2_ = 0x694c;
  local_e8.field_2._M_local_buf[7] = 'm';
  local_e8.field_2._8_2_ = 0x7469;
  local_e8._M_string_length = 10;
  local_e8.field_2._M_local_buf[10] = '\0';
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_90,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  local_e8.field_2._M_allocated_capacity._0_5_ = 0x496c696166;
  local_e8.field_2._M_allocated_capacity._5_2_ = 0x4566;
  local_e8.field_2._M_local_buf[7] = 'x';
  local_e8.field_2._8_2_ = 0x7274;
  local_e8.field_2._M_local_buf[10] = 'a';
  local_e8._M_string_length = 0xb;
  local_e8.field_2._M_local_buf[0xb] = '\0';
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_90,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  local_e8.field_2._M_allocated_capacity._0_5_ = 0x63656a6572;
  local_e8.field_2._M_allocated_capacity._5_2_ = 0x4474;
  local_e8.field_2._M_local_buf[7] = 'u';
  local_e8.field_2._8_2_ = 0x4b70;
  local_e8.field_2._M_local_buf[10] = 'e';
  local_e8.field_2._M_local_buf[0xb] = 'y';
  local_e8.field_2._M_local_buf[0xc] = 's';
  local_e8._M_string_length = 0xd;
  local_e8.field_2._M_local_buf[0xd] = '\0';
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_90,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  local_c8 = (pointer)0x12;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  local_e8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_e8,(ulong)&local_c8);
  local_e8.field_2._M_allocated_capacity._0_5_ = SUB85(local_c8,0);
  local_e8.field_2._M_allocated_capacity._5_2_ = (undefined2)((ulong)local_c8 >> 0x28);
  local_e8.field_2._M_local_buf[7] = (char)((ulong)local_c8 >> 0x38);
  builtin_strncpy(local_e8._M_dataplus._M_p,"allowSpecialFloats",0x12);
  local_e8._M_string_length = (size_type)local_c8;
  local_e8._M_dataplus._M_p[(long)local_c8] = '\0';
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_90,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  local_60 = &this->settings_;
  Value::getMemberNames_abi_cxx11_((Members *)&local_e8,local_60);
  if (local_e8._M_string_length - (long)local_e8._M_dataplus._M_p != 0) {
    lVar11 = (long)(local_e8._M_string_length - (long)local_e8._M_dataplus._M_p) >> 5;
    lVar11 = lVar11 + (ulong)(lVar11 == 0);
    lVar12 = 0;
    do {
      _Var7._M_p = local_e8._M_dataplus._M_p;
      iVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&local_90,(key_type *)(local_e8._M_dataplus._M_p + lVar12));
      if ((_Rb_tree_header *)iVar9._M_node == &local_90._M_impl.super__Rb_tree_header) {
        other = (undefined1 *)
                Value::find(local_60,*(char **)(_Var7._M_p + lVar12),
                            *(char **)(_Var7._M_p + lVar12) + *(long *)(_Var7._M_p + lVar12 + 8));
        if ((Value *)other == (Value *)0x0) {
          other = kNull;
        }
        Value::Value((Value *)&local_b8,(Value *)other);
        pVVar10 = &Value::resolveReference
                             (local_c0,*(char **)(_Var7._M_p + lVar12),
                              *(char **)(_Var7._M_p + lVar12) + *(long *)(_Var7._M_p + lVar12 + 8))
                   ->value_;
        uVar2 = *(ushort *)(pVVar10 + 1);
        *(ushort *)(pVVar10 + 1) = uVar2 & 0xff00 | local_b0 & 0xff;
        VVar3 = *pVVar10;
        *pVVar10 = local_b8;
        *(ushort *)(pVVar10 + 1) = uVar2 & 0xfe00 | local_b0 & 0xff | local_b0 & 0x100;
        local_b0 = local_b0 & 0xfe00 | uVar2 & 0xff | uVar2 & 0x100;
        VVar4 = pVVar10[2];
        pVVar10[2] = local_a8;
        VVar5 = pVVar10[3];
        pVVar10[3] = local_a0;
        VVar6 = pVVar10[4];
        pVVar10[4] = local_98;
        local_b8 = VVar3;
        local_a8 = VVar4;
        local_a0 = VVar5;
        local_98 = VVar6;
        Value::~Value((Value *)&local_b8);
      }
      lVar12 = lVar12 + 0x20;
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
  }
  AVar8 = Value::size(local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_e8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_90);
  Value::~Value(&local_58);
  return AVar8 == 0;
}

Assistant:

bool CharReaderBuilder::validate(Json::Value* invalid) const
{
  Json::Value my_invalid;
  if (!invalid) invalid = &my_invalid;  // so we do not need to test for NULL
  Json::Value& inv = *invalid;
  std::set<JSONCPP_STRING> valid_keys;
  getValidReaderKeys(&valid_keys);
  Value::Members keys = settings_.getMemberNames();
  size_t n = keys.size();
  for (size_t i = 0; i < n; ++i) {
    JSONCPP_STRING const& key = keys[i];
    if (valid_keys.find(key) == valid_keys.end()) {
      inv[key] = settings_[key];
    }
  }
  return 0u == inv.size();
}